

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retrieval.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long lVar1;
  void *pvVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  pointer pbVar7;
  pointer pbVar8;
  pointer pcVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  pointer pbVar12;
  int32_t iVar13;
  bool bVar14;
  char cVar15;
  uint uVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  common_log *pcVar20;
  long *plVar21;
  long lVar22;
  undefined8 uVar23;
  ulong uVar24;
  size_type __n;
  char *fmt;
  long lVar25;
  int iVar26;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *context_file;
  ulong uVar27;
  pointer pbVar28;
  pointer pcVar29;
  float *__first;
  float fVar30;
  vector<chunk,_std::allocator<chunk>_> chunks;
  vector<chunk,_std::allocator<chunk>_> file_chunk;
  vector<std::pair<int,_float>,_std::allocator<std::pair<int,_float>_>_> similarities;
  string query;
  vector<float,_std::allocator<float>_> embeddings;
  common_init_result llama_init;
  vector<float,_std::allocator<float>_> query_emb;
  llama_batch batch;
  llama_batch query_batch;
  common_params params;
  pointer local_1b38;
  vector<chunk,_std::allocator<chunk>_> local_1b28;
  pointer local_1b08;
  long local_1b00;
  undefined1 local_1af8 [16];
  pointer local_1ae8;
  undefined1 local_1ad8 [16];
  long local_1ac8;
  undefined1 local_1ab8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1aa8;
  undefined1 local_1a98 [16];
  undefined1 local_1a88 [16];
  undefined8 local_1a78;
  void *pvStack_1a70;
  undefined8 local_1a68;
  pointer piStack_1a60;
  void *local_1a58;
  undefined8 uStack_1a50;
  long local_1a48;
  undefined1 local_1a40 [17];
  undefined7 uStack_1a2f;
  undefined1 local_1a20 [32];
  pointer local_1a00;
  _Alloc_hider local_19f8;
  size_type local_19f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_19e8;
  undefined1 local_19d8 [16];
  undefined1 local_19c8 [16];
  undefined1 local_19b8 [16];
  vector<float,_std::allocator<float>_> local_19a8;
  pair<int,_float> local_1990;
  undefined1 local_1988 [1032];
  llama_batch local_1580 [9];
  common_params local_1378;
  
  common_params::common_params(&local_1378);
  bVar14 = common_params_parse(argc,argv,&local_1378,LLAMA_EXAMPLE_RETRIEVAL,print_usage);
  iVar18 = 1;
  if (!bVar14) goto LAB_00125b92;
  common_init();
  local_1378.n_ubatch = local_1378.n_batch;
  local_1378.embedding = true;
  if (local_1378.chunk_size < 1) {
    if (common_log_verbosity_thold < 0) goto LAB_00125b92;
    pcVar20 = common_log_main();
    fmt = "chunk_size must be positive\n";
  }
  else {
    if (local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      pbVar7 = local_1378.context_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pbVar28 = local_1378.context_files.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar8 = local_1378.context_files.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (-1 < common_log_verbosity_thold) {
        pcVar20 = common_log_main();
        common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"processing files:\n");
        pbVar7 = local_1378.context_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar28 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = local_1378.context_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      for (; pbVar12 = local_1378.context_files.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
          pbVar7 != local_1378.context_files.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; pbVar7 = pbVar7 + 1) {
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = pbVar28;
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar8;
        if (-1 < common_log_verbosity_thold) {
          pcVar20 = common_log_main();
          common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"%s\n");
        }
        pbVar28 = local_1378.context_files.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar8 = local_1378.context_files.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_1378.context_files.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = pbVar12;
      }
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (pbVar28 != pbVar8) {
        do {
          iVar13 = local_1378.chunk_size;
          local_1af8 = (undefined1  [16])0x0;
          local_1ae8 = (pointer)0x0;
          std::ifstream::ifstream(local_1580,(pbVar28->_M_dataplus)._M_p,_S_in);
          cVar15 = std::__basic_file<char>::is_open();
          if (cVar15 == '\0') {
            if (-1 < common_log_verbosity_thold) {
              pcVar20 = common_log_main();
              common_log_add(pcVar20,GGML_LOG_LEVEL_ERROR,"could not open file %s\n",
                             (pbVar28->_M_dataplus)._M_p);
            }
          }
          else {
            local_1a20._8_8_ = (__uniq_ptr_impl<llama_context,_llama_context_deleter>)0x0;
            local_1a20[0x10] = '\0';
            local_19f8._M_p = (pointer)&local_19e8;
            local_19f0 = 0;
            local_19e8._M_local_buf[0] = '\0';
            local_19b8 = (undefined1  [16])0x0;
            local_19c8 = (undefined1  [16])0x0;
            local_19d8 = (undefined1  [16])0x0;
            local_1a40._0_8_ = local_1a40 + 0x10;
            local_1a40._8_8_ = (pointer)0x0;
            local_1a40[0x10] = 0;
            local_1b38 = (pointer)0x0;
            local_1a20._0_8_ = local_1a20 + 0x10;
            while( true ) {
              plVar21 = (long *)std::istream::read((char *)local_1580,(long)local_1988);
              if ((*(byte *)((long)plVar21 + *(long *)(*plVar21 + -0x18) + 0x20) & 5) != 0) break;
              local_1ab8._0_8_ = &local_1aa8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1ab8,local_1988,
                         (undefined1 *)((long)local_1580[0].token + (long)local_1988));
              std::__cxx11::string::_M_append(local_1a40,local_1ab8._0_8_);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1ab8._0_8_ != &local_1aa8) {
                operator_delete((void *)local_1ab8._0_8_,local_1aa8._M_allocated_capacity + 1);
              }
              lVar22 = std::__cxx11::string::find
                                 (local_1a40,(ulong)local_1378.chunk_separator._M_dataplus._M_p,0);
              while (lVar22 != -1) {
                std::__cxx11::string::substr((ulong)local_1ab8,(ulong)local_1a40);
                std::__cxx11::string::_M_append((char *)&local_19f8,local_1ab8._0_8_);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1ab8._0_8_ != &local_1aa8) {
                  operator_delete((void *)local_1ab8._0_8_,local_1aa8._M_allocated_capacity + 1);
                }
                if (iVar13 < (int)local_19f0) {
                  local_1a00 = local_1b38;
                  std::__cxx11::string::_M_assign((string *)local_1a20);
                  std::vector<chunk,_std::allocator<chunk>_>::push_back
                            ((vector<chunk,_std::allocator<chunk>_> *)local_1af8,
                             (value_type *)local_1a20);
                  lVar22 = (long)(int)local_19f0;
                  local_1a78 = 0;
                  local_1ab8._8_8_ = 0;
                  local_1ab8._0_8_ = &local_1aa8;
                  local_1aa8._1_15_ = SUB1615((undefined1  [16])0x0,1);
                  auVar3[0xf] = 0;
                  auVar3._0_15_ = local_1aa8._1_15_;
                  local_1aa8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                )(auVar3 << 8);
                  auVar6._8_8_ = 0;
                  auVar6._0_8_ = local_1a88 + 8;
                  local_1a98 = auVar6 << 0x40;
                  local_1a88._0_9_ = ZEXT89(0);
                  local_1a88._9_7_ = 0;
                  uStack_1a50 = 0;
                  local_1a48 = 0;
                  piStack_1a60 = (pointer)0x0;
                  local_1a58 = (void *)0x0;
                  pvStack_1a70 = (void *)0x0;
                  local_1a68 = 0;
                  std::__cxx11::string::operator=((string *)local_1a20,(string *)local_1ab8);
                  local_1a00 = (pointer)local_1a98._0_8_;
                  std::__cxx11::string::operator=((string *)&local_19f8,(string *)(local_1a98 + 8));
                  uVar10 = local_19d8._0_8_;
                  uVar11 = local_19c8._0_8_;
                  local_19d8._8_8_ = local_1a68;
                  local_19d8._0_8_ = pvStack_1a70;
                  local_19c8._0_8_ = piStack_1a60;
                  piStack_1a60 = (pointer)0x0;
                  pvStack_1a70 = (void *)0x0;
                  local_1a68 = 0;
                  if ((pointer)uVar10 != (pointer)0x0) {
                    operator_delete((void *)uVar10,uVar11 - uVar10);
                  }
                  uVar11 = local_19b8._8_8_;
                  uVar10 = local_19c8._8_8_;
                  local_19c8._8_8_ = local_1a58;
                  local_19b8._8_8_ = local_1a48;
                  local_19b8._0_8_ = uStack_1a50;
                  local_1a58 = (void *)0x0;
                  uStack_1a50 = 0;
                  local_1a48 = 0;
                  if ((pointer)uVar10 != (pointer)0x0) {
                    operator_delete((void *)uVar10,uVar11 - uVar10);
                  }
                  if (local_1a58 != (void *)0x0) {
                    operator_delete(local_1a58,local_1a48 - (long)local_1a58);
                  }
                  if (pvStack_1a70 != (void *)0x0) {
                    operator_delete(pvStack_1a70,(long)piStack_1a60 - (long)pvStack_1a70);
                  }
                  if ((undefined1 *)local_1a98._8_8_ != local_1a88 + 8) {
                    operator_delete((void *)local_1a98._8_8_,local_1a88._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_1ab8._0_8_ != &local_1aa8) {
                    operator_delete((void *)local_1ab8._0_8_,local_1aa8._M_allocated_capacity + 1);
                  }
                  local_1b38 = (pointer)((long)&(local_1b38->_M_t).
                                                super___uniq_ptr_impl<llama_adapter_lora,_llama_adapter_lora_deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_llama_adapter_lora_*,_llama_adapter_lora_deleter>
                                                .super__Head_base<0UL,_llama_adapter_lora_*,_false>.
                                                _M_head_impl + lVar22);
                }
                std::__cxx11::string::substr((ulong)local_1ab8,(ulong)local_1a40);
                std::__cxx11::string::operator=((string *)local_1a40,(string *)local_1ab8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1ab8._0_8_ != &local_1aa8) {
                  operator_delete((void *)local_1ab8._0_8_,local_1aa8._M_allocated_capacity + 1);
                }
                lVar22 = std::__cxx11::string::find
                                   ((char *)local_1a40,
                                    (ulong)local_1378.chunk_separator._M_dataplus._M_p,0);
              }
            }
            if (local_19f0 != 0) {
              if (local_1af8._0_8_ == local_1af8._8_8_) {
                local_1a00 = local_1b38;
                std::__cxx11::string::_M_assign((string *)local_1a20);
                std::vector<chunk,_std::allocator<chunk>_>::push_back
                          ((vector<chunk,_std::allocator<chunk>_> *)local_1af8,
                           (value_type *)local_1a20);
              }
              else {
                std::__cxx11::string::_M_append
                          ((char *)&((pointer)(local_1af8._8_8_ + -0x78))->textdata,
                           (ulong)local_19f8._M_p);
              }
            }
            std::ifstream::close();
            if ((undefined1 *)local_1a40._0_8_ != local_1a40 + 0x10) {
              operator_delete((void *)local_1a40._0_8_,CONCAT71(uStack_1a2f,local_1a40[0x10]) + 1);
            }
            if ((pointer)local_19c8._8_8_ != (pointer)0x0) {
              operator_delete((void *)local_19c8._8_8_,local_19b8._8_8_ - local_19c8._8_8_);
            }
            if ((pointer)local_19d8._0_8_ != (pointer)0x0) {
              operator_delete((void *)local_19d8._0_8_,local_19c8._0_8_ - local_19d8._0_8_);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_19f8._M_p != &local_19e8) {
              operator_delete(local_19f8._M_p,
                              CONCAT71(local_19e8._M_allocated_capacity._1_7_,
                                       local_19e8._M_local_buf[0]) + 1);
            }
            if ((undefined1 *)local_1a20._0_8_ != local_1a20 + 0x10) {
              operator_delete((void *)local_1a20._0_8_,
                              CONCAT71(local_1a20._17_7_,local_1a20[0x10]) + 1);
            }
          }
          std::ifstream::~ifstream(local_1580);
          std::vector<chunk,std::allocator<chunk>>::
          _M_range_insert<__gnu_cxx::__normal_iterator<chunk*,std::vector<chunk,std::allocator<chunk>>>>
                    ((vector<chunk,std::allocator<chunk>> *)&local_1b28,
                     local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                     super__Vector_impl_data._M_finish,local_1af8._0_8_);
          std::vector<chunk,_std::allocator<chunk>_>::~vector
                    ((vector<chunk,_std::allocator<chunk>_> *)local_1af8);
          pbVar28 = pbVar28 + 1;
        } while (pbVar28 != pbVar8);
      }
      if (-1 < common_log_verbosity_thold) {
        pcVar20 = common_log_main();
        common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"Number of chunks: %zu\n",
                       ((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_finish -
                        (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                              super__Vector_impl_data._M_start >> 3) * -0x1111111111111111);
      }
      llama_backend_init();
      llama_numa_init(local_1378.numa);
      common_init_from_params((common_init_result *)local_1a20,&local_1378);
      uVar11 = local_1a20._8_8_;
      uVar10 = local_1a20._0_8_;
      if ((pointer)local_1a20._0_8_ == (pointer)0x0) {
        iVar18 = 1;
        if (-1 < common_log_verbosity_thold) {
          pcVar20 = common_log_main();
          common_log_add(pcVar20,GGML_LOG_LEVEL_ERROR,"%s: unable to load model\n","main");
        }
      }
      else {
        uVar23 = llama_model_get_vocab(local_1a20._0_8_);
        uVar16 = llama_model_n_ctx_train(uVar10);
        local_1b08 = (pointer)uVar10;
        uVar17 = llama_n_ctx(uVar11);
        iVar18 = llama_pooling_type(uVar11);
        if (iVar18 == 0) {
          iVar18 = 1;
          if (-1 < common_log_verbosity_thold) {
            pcVar20 = common_log_main();
            common_log_add(pcVar20,GGML_LOG_LEVEL_ERROR,"%s: pooling type NONE not supported\n",
                           "main");
          }
        }
        else {
          if (((int)uVar16 < (int)uVar17) && (-1 < common_log_verbosity_thold)) {
            pcVar20 = common_log_main();
            common_log_add(pcVar20,GGML_LOG_LEVEL_WARN,
                           "%s: warning: model was trained on only %d context tokens (%d specified)\n"
                           ,"main",(ulong)uVar16,(ulong)uVar17);
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar20 = common_log_main();
            common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"\n");
          }
          if (-1 < common_log_verbosity_thold) {
            pcVar20 = common_log_main();
            common_params_get_system_info_abi_cxx11_((string *)local_1988,&local_1378);
            common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"%s\n",
                           CONCAT44(local_1988._4_4_,local_1988._0_4_));
            if ((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_) != local_1988 + 0x10) {
              operator_delete((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_),
                              local_1988._16_8_ + 1);
            }
          }
          uVar24 = (ulong)local_1378.n_batch;
          if (local_1378.n_batch < local_1378.n_ctx) {
            ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/examples/retrieval/retrieval.cpp"
                       ,0xba,"GGML_ASSERT(%s) failed","params.n_batch >= params.n_ctx");
          }
          pcVar9 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          bVar14 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_start ==
                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          if (bVar14) {
            iVar18 = 0;
          }
          else {
            iVar18 = 0;
            pcVar29 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                      super__Vector_impl_data._M_start;
            do {
              common_tokenize((vector<int,_std::allocator<int>_> *)local_1988,
                              (llama_context *)uVar11,&pcVar29->textdata,true,false);
              uVar27 = local_1988._8_8_ - CONCAT44(local_1988._4_4_,local_1988._0_4_) >> 2;
              if (uVar24 < uVar27) {
                iVar18 = 1;
                if (-1 < common_log_verbosity_thold) {
                  pcVar20 = common_log_main();
                  common_log_add(pcVar20,GGML_LOG_LEVEL_ERROR,
                                 "%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n"
                                 ,"main",local_1988._8_8_ -
                                         CONCAT44(local_1988._4_4_,local_1988._0_4_) >> 2,uVar24);
                }
              }
              else {
                iVar26 = llama_vocab_eos(uVar23);
                if ((-1 < iVar26) &&
                   (((int *)CONCAT44(local_1988._4_4_,local_1988._0_4_) == (int *)local_1988._8_8_
                    || (iVar26 = *(int *)(local_1988._8_8_ + -4), iVar19 = llama_vocab_eos(uVar23),
                       iVar26 != iVar19)))) {
                  local_1580[0].n_tokens = llama_vocab_eos(uVar23);
                  if (local_1988._8_8_ == local_1988._16_8_) {
                    std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                              ((vector<int,_std::allocator<int>_> *)local_1988,
                               (iterator)local_1988._8_8_,&local_1580[0].n_tokens);
                  }
                  else {
                    *(int32_t *)local_1988._8_8_ = local_1580[0].n_tokens;
                    local_1988._8_8_ = local_1988._8_8_ + 4;
                  }
                }
                std::vector<int,_std::allocator<int>_>::operator=
                          (&pcVar29->tokens,(vector<int,_std::allocator<int>_> *)local_1988);
              }
              pvVar2 = (void *)CONCAT44(local_1988._4_4_,local_1988._0_4_);
              if (pvVar2 != (void *)0x0) {
                operator_delete(pvVar2,local_1988._16_8_ - (long)pvVar2);
              }
              if (uVar24 < uVar27) break;
              pcVar29 = pcVar29 + 1;
              bVar14 = pcVar29 == pcVar9;
            } while (!bVar14);
          }
          if (bVar14) {
            if (local_1378.verbose_prompt == true) {
              if (0 < (int)((ulong)((long)local_1b28.
                                          super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                          super__Vector_impl_data._M_finish -
                                   (long)local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_start) >> 3) * -0x11111111) {
                uVar27 = 0;
                do {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"%s: prompt %d: \'%s\'\n","main",
                                   uVar27 & 0xffffffff,
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar27].textdata.
                                   _M_dataplus._M_p);
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,
                                   "%s: number of tokens in prompt = %zu\n","main",
                                   (long)local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar27].tokens.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_finish -
                                   (long)local_1b28.
                                         super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                         super__Vector_impl_data._M_start[uVar27].tokens.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start >> 2);
                  }
                  if (0 < (int)((ulong)((long)local_1b28.
                                              super__Vector_base<chunk,_std::allocator<chunk>_>.
                                              _M_impl.super__Vector_impl_data._M_start[uVar27].
                                              tokens.super__Vector_base<int,_std::allocator<int>_>.
                                              _M_impl.super__Vector_impl_data._M_finish -
                                       (long)local_1b28.
                                             super__Vector_base<chunk,_std::allocator<chunk>_>.
                                             _M_impl.super__Vector_impl_data._M_start[uVar27].tokens
                                             .super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2)) {
                    lVar22 = 0;
                    do {
                      if (-1 < common_log_verbosity_thold) {
                        pcVar20 = common_log_main();
                        uVar16 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                 _M_impl.super__Vector_impl_data._M_start[uVar27].tokens.
                                 super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start[lVar22];
                        common_token_to_piece_abi_cxx11_
                                  ((string *)local_1988,(llama_context *)uVar11,
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar27].tokens.
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start[lVar22],true);
                        common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"%6d -> \'%s\'\n",(ulong)uVar16,
                                       CONCAT44(local_1988._4_4_,local_1988._0_4_));
                        if ((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_) !=
                            local_1988 + 0x10) {
                          operator_delete((undefined1 *)CONCAT44(local_1988._4_4_,local_1988._0_4_),
                                          local_1988._16_8_ + 1);
                        }
                      }
                      lVar22 = lVar22 + 1;
                    } while (lVar22 < (int)((ulong)((long)local_1b28.
                                                                                                                    
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27].
                                                  tokens.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_1b28.
                                                                                                                
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start[uVar27].
                                                  tokens.
                                                  super__Vector_base<int,_std::allocator<int>_>.
                                                  _M_impl.super__Vector_impl_data._M_start) >> 2));
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_INFO,"\n\n");
                  }
                  uVar27 = uVar27 + 1;
                } while ((long)uVar27 <
                         (long)((int)((ulong)((long)local_1b28.
                                                                                                        
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_finish -
                                             (long)local_1b28.
                                                   super__Vector_base<chunk,_std::allocator<chunk>_>
                                                   ._M_impl.super__Vector_impl_data._M_start) >> 3)
                               * -0x11111111));
              }
            }
            lVar22 = (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                     (long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                           super__Vector_impl_data._M_start;
            llama_batch_init(local_1988,uVar24,0,1);
            iVar18 = llama_model_n_embd(local_1b08);
            local_1b08 = (pointer)CONCAT44(local_1b08._4_4_,iVar18);
            local_1b00 = (lVar22 >> 3) * -0x1111111111111111;
            local_1580[0].n_tokens = 0;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)local_1a40,
                       (long)(iVar18 * (int)local_1b00),(value_type_conflict2 *)local_1580,
                       (allocator_type *)local_1ab8);
            __first = (float *)local_1a40._0_8_;
            iVar18 = 0;
            iVar26 = 0;
            if (0 < (int)(uint)local_1b00) {
              uVar27 = (ulong)((uint)local_1b00 & 0x7fffffff);
              iVar26 = 0;
              lVar22 = 0x48;
              iVar18 = 0;
              do {
                pcVar9 = local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                         super__Vector_impl_data._M_start;
                if (uVar24 < (ulong)((long)(int)local_1988._0_4_ +
                                    (*(long *)((long)&((local_1b28.
                                                                                                                
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->
                                                  filename)._M_string_length + lVar22) -
                                     *(long *)((long)&((local_1b28.
                                                                                                                
                                                  super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                  _M_impl.super__Vector_impl_data._M_start)->
                                                  filename)._M_dataplus._M_p + lVar22) >> 2))) {
                  batch_decode((llama_context *)uVar11,(llama_batch *)local_1988,
                               __first + iVar18 * (int)local_1b08,iVar26,(int)local_1b08);
                  common_batch_clear((llama_batch *)local_1988);
                  iVar18 = iVar18 + iVar26;
                  iVar26 = 0;
                }
                batch_add_seq((llama_batch *)local_1988,
                              (vector<int,_std::allocator<int>_> *)
                              ((long)&(pcVar9->filename)._M_dataplus._M_p + lVar22),iVar26);
                iVar26 = iVar26 + 1;
                lVar22 = lVar22 + 0x78;
                uVar27 = uVar27 - 1;
              } while (uVar27 != 0);
            }
            batch_decode((llama_context *)uVar11,(llama_batch *)local_1988,
                         __first + iVar18 * (int)local_1b08,iVar26,(int)local_1b08);
            if (0 < (int)(uint)local_1b00) {
              lVar22 = (long)(int)local_1b08;
              uVar27 = (ulong)((uint)local_1b00 & 0x7fffffff);
              lVar25 = 0x60;
              do {
                std::vector<float,std::allocator<float>>::vector<float*,void>
                          ((vector<float,std::allocator<float>> *)local_1580,__first,
                           __first + lVar22,(allocator_type *)local_1ab8);
                std::vector<float,_std::allocator<float>_>::_M_move_assign
                          ((vector<float,_std::allocator<float>_> *)
                           ((long)&((local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                     _M_impl.super__Vector_impl_data._M_start)->filename).
                                   _M_dataplus._M_p + lVar25),local_1580);
                pvVar2 = (void *)CONCAT44(local_1580[0]._4_4_,local_1580[0].n_tokens);
                if (pvVar2 != (void *)0x0) {
                  operator_delete(pvVar2,(long)local_1580[0].embd - (long)pvVar2);
                }
                lVar1 = *(long *)((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar25 + -0x18);
                if (*(long *)((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                    _M_impl.super__Vector_impl_data._M_start + lVar25 + -0x10) !=
                    lVar1) {
                  *(long *)((long)local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar25 + -0x10) = lVar1
                  ;
                }
                lVar25 = lVar25 + 0x78;
                uVar27 = uVar27 - 1;
                __first = __first + lVar22;
              } while (uVar27 != 0);
            }
            llama_batch_init(local_1580,uVar24,0,1);
            local_1ab8._8_8_ = 0;
            local_1ab8._0_8_ = &local_1aa8;
            auVar4[0xf] = 0;
            auVar4._0_15_ = local_1aa8._1_15_;
            local_1aa8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          )(auVar4 << 8);
            __n = (size_type)(int)local_1b08;
            uVar16 = (uint)local_1b00;
            do {
              if (-1 < common_log_verbosity_thold) {
                pcVar20 = common_log_main();
                common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"Enter query: ");
              }
              std::getline<char,std::char_traits<char>,std::allocator<char>>
                        ((istream *)&std::cin,(string *)local_1ab8);
              common_tokenize((vector<int,_std::allocator<int>_> *)local_1af8,
                              (llama_context *)uVar11,(string *)local_1ab8,true,false);
              batch_add_seq(local_1580,(vector<int,_std::allocator<int>_> *)local_1af8,0);
              auVar5._12_4_ = 0;
              auVar5._0_12_ = local_1ad8._4_12_;
              local_1ad8 = auVar5 << 0x20;
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_19a8,__n,(value_type_conflict2 *)local_1ad8,
                         (allocator_type *)&local_1990);
              batch_decode((llama_context *)uVar11,local_1580,
                           local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start,1,(int)local_1b08);
              common_batch_clear(local_1580);
              local_1ad8 = (undefined1  [16])0x0;
              local_1ac8 = 0;
              if (0 < (int)(uint)local_1b00) {
                lVar22 = 0x60;
                uVar24 = 0;
                do {
                  fVar30 = common_embd_similarity_cos
                                     (*(float **)
                                       ((long)&((local_1b28.
                                                 super__Vector_base<chunk,_std::allocator<chunk>_>.
                                                 _M_impl.super__Vector_impl_data._M_start)->filename
                                               )._M_dataplus._M_p + lVar22),
                                      local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start,(int)local_1b08);
                  local_1990 = (pair<int,_float>)(((ulong)(uint)fVar30 << 0x20) + uVar24);
                  std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>::
                  emplace_back<std::pair<int,float>>
                            ((vector<std::pair<int,float>,std::allocator<std::pair<int,float>>> *)
                             local_1ad8,&local_1990);
                  uVar24 = uVar24 + 1;
                  lVar22 = lVar22 + 0x78;
                } while ((uVar16 & 0x7fffffff) != uVar24);
              }
              std::
              sort<__gnu_cxx::__normal_iterator<std::pair<int,float>*,std::vector<std::pair<int,float>,std::allocator<std::pair<int,float>>>>,main::__0>
                        (local_1ad8._0_8_);
              if (-1 < common_log_verbosity_thold) {
                pcVar20 = common_log_main();
                common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"Top %d similar chunks:\n",
                               (ulong)(uint)local_1378.sampling.top_k);
              }
              iVar18 = (int)((ulong)((long)local_1b28.
                                           super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl
                                           .super__Vector_impl_data._M_finish -
                                    (long)local_1b28.
                                          super__Vector_base<chunk,_std::allocator<chunk>_>._M_impl.
                                          super__Vector_impl_data._M_start) >> 3);
              uVar17 = iVar18 * -0x11111111;
              if (SBORROW4(local_1378.sampling.top_k,uVar17) !=
                  local_1378.sampling.top_k + iVar18 * 0x11111111 < 0) {
                uVar17 = local_1378.sampling.top_k;
              }
              if (0 < (int)uVar17) {
                lVar22 = 0;
                do {
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"filename: %s\n",
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(local_1ad8._0_8_ + lVar22 * 8)].filename._M_dataplus.
                                   _M_p);
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"filepos: %lld\n",
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(local_1ad8._0_8_ + lVar22 * 8)].filepos);
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"similarity: %f\n",
                                   (double)*(float *)(local_1ad8._0_8_ + 4 + lVar22 * 8));
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"textdata:\n%s\n",
                                   local_1b28.super__Vector_base<chunk,_std::allocator<chunk>_>.
                                   _M_impl.super__Vector_impl_data._M_start
                                   [*(int *)(local_1ad8._0_8_ + lVar22 * 8)].textdata._M_dataplus.
                                   _M_p);
                  }
                  if (-1 < common_log_verbosity_thold) {
                    pcVar20 = common_log_main();
                    common_log_add(pcVar20,GGML_LOG_LEVEL_NONE,"--------------------\n");
                  }
                  lVar22 = lVar22 + 1;
                  iVar18 = (int)((ulong)((long)local_1b28.
                                               super__Vector_base<chunk,_std::allocator<chunk>_>.
                                               _M_impl.super__Vector_impl_data._M_finish -
                                        (long)local_1b28.
                                              super__Vector_base<chunk,_std::allocator<chunk>_>.
                                              _M_impl.super__Vector_impl_data._M_start) >> 3);
                  uVar17 = iVar18 * -0x11111111;
                  if (SBORROW4(local_1378.sampling.top_k,uVar17) !=
                      local_1378.sampling.top_k + iVar18 * 0x11111111 < 0) {
                    uVar17 = local_1378.sampling.top_k;
                  }
                } while (lVar22 < (int)uVar17);
              }
              if ((void *)local_1ad8._0_8_ != (void *)0x0) {
                operator_delete((void *)local_1ad8._0_8_,local_1ac8 - local_1ad8._0_8_);
              }
              if (local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                  super__Vector_impl_data._M_start != (float *)0x0) {
                operator_delete(local_19a8.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                .super__Vector_impl_data._M_start,
                                (long)local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_19a8.super__Vector_base<float,_std::allocator<float>_>.
                                      _M_impl.super__Vector_impl_data._M_start);
              }
              if ((pointer)local_1af8._0_8_ != (pointer)0x0) {
                operator_delete((void *)local_1af8._0_8_,(long)local_1ae8 - local_1af8._0_8_);
              }
            } while( true );
          }
        }
      }
      std::
      vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
      ::~vector((vector<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>,_std::allocator<std::unique_ptr<llama_adapter_lora,_llama_adapter_lora_deleter>_>_>
                 *)(local_1a20 + 0x10));
      std::unique_ptr<llama_context,_llama_context_deleter>::~unique_ptr
                ((unique_ptr<llama_context,_llama_context_deleter> *)(local_1a20 + 8));
      std::unique_ptr<llama_model,_llama_model_deleter>::~unique_ptr
                ((unique_ptr<llama_model,_llama_model_deleter> *)local_1a20);
      std::vector<chunk,_std::allocator<chunk>_>::~vector(&local_1b28);
      goto LAB_00125b92;
    }
    if (common_log_verbosity_thold < 0) goto LAB_00125b92;
    pcVar20 = common_log_main();
    fmt = "context_files must be specified\n";
  }
  common_log_add(pcVar20,GGML_LOG_LEVEL_ERROR,fmt);
LAB_00125b92:
  common_params::~common_params(&local_1378);
  return iVar18;
}

Assistant:

int main(int argc, char ** argv) {
    common_params params;

    if (!common_params_parse(argc, argv, params, LLAMA_EXAMPLE_RETRIEVAL, print_usage)) {
        return 1;
    }

    common_init();

    // For BERT models, batch size must be equal to ubatch size
    params.n_ubatch = params.n_batch;
    params.embedding = true;

    if (params.chunk_size <= 0) {
        LOG_ERR("chunk_size must be positive\n");
        return 1;
    }
    if (params.context_files.empty()) {
        LOG_ERR("context_files must be specified\n");
        return 1;
    }

    LOG_INF("processing files:\n");
    for (auto & context_file : params.context_files) {
        LOG_INF("%s\n", context_file.c_str());
    }

    std::vector<chunk> chunks;
    for (auto & context_file : params.context_files) {
        std::vector<chunk> file_chunk = chunk_file(context_file, params.chunk_size, params.chunk_separator);
        chunks.insert(chunks.end(), file_chunk.begin(), file_chunk.end());
    }
    LOG_INF("Number of chunks: %zu\n", chunks.size());

    llama_backend_init();
    llama_numa_init(params.numa);

    // load the model
    common_init_result llama_init = common_init_from_params(params);

    llama_model * model = llama_init.model.get();
    llama_context * ctx = llama_init.context.get();

    if (model == NULL) {
        LOG_ERR("%s: unable to load model\n", __func__);
        return 1;
    }

    const llama_vocab * vocab = llama_model_get_vocab(model);

    const int n_ctx_train = llama_model_n_ctx_train(model);
    const int n_ctx = llama_n_ctx(ctx);

    const enum llama_pooling_type pooling_type = llama_pooling_type(ctx);
    if (pooling_type == LLAMA_POOLING_TYPE_NONE) {
        LOG_ERR("%s: pooling type NONE not supported\n", __func__);
        return 1;
    }

    if (n_ctx > n_ctx_train) {
        LOG_WRN("%s: warning: model was trained on only %d context tokens (%d specified)\n",
                __func__, n_ctx_train, n_ctx);
    }

    // print system information
    {
        LOG_INF("\n");
        LOG_INF("%s\n", common_params_get_system_info(params).c_str());
    }

    // max batch size
    const uint64_t n_batch = params.n_batch;
    GGML_ASSERT(params.n_batch >= params.n_ctx);

    // tokenize the prompts and trim
    for (auto & chunk : chunks) {
        auto inp = common_tokenize(ctx, chunk.textdata, true, false);
        if (inp.size() > n_batch) {
            LOG_ERR("%s: chunk size (%lld) exceeds batch size (%lld), increase batch size and re-run\n",
                    __func__, (long long int) inp.size(), (long long int) n_batch);
            return 1;
        }
        // add eos if not present
        if (llama_vocab_eos(vocab) >= 0 && (inp.empty() || inp.back() != llama_vocab_eos(vocab))) {
            inp.push_back(llama_vocab_eos(vocab));
        }
        chunk.tokens = inp;
    }

    // tokenization stats
    if (params.verbose_prompt) {
        for (int i = 0; i < (int) chunks.size(); i++) {
            LOG_INF("%s: prompt %d: '%s'\n", __func__, i, chunks[i].textdata.c_str());
            LOG_INF("%s: number of tokens in prompt = %zu\n", __func__, chunks[i].tokens.size());
            for (int j = 0; j < (int) chunks[i].tokens.size(); j++) {
                LOG_INF("%6d -> '%s'\n", chunks[i].tokens[j], common_token_to_piece(ctx, chunks[i].tokens[j]).c_str());
            }
            LOG_INF("\n\n");
        }
    }

    // initialize batch
    const int n_chunks = chunks.size();
    struct llama_batch batch = llama_batch_init(n_batch, 0, 1);

    // allocate output
    const int n_embd = llama_model_n_embd(model);
    std::vector<float> embeddings(n_chunks * n_embd, 0);
    float * emb = embeddings.data();

    // break into batches
    int p = 0; // number of prompts processed already
    int s = 0; // number of prompts in current batch
    for (int k = 0; k < n_chunks; k++) {
        // clamp to n_batch tokens
        auto & inp = chunks[k].tokens;

        const uint64_t n_toks = inp.size();

        // encode if at capacity
        if (batch.n_tokens + n_toks > n_batch) {
            float * out = emb + p * n_embd;
            batch_decode(ctx, batch, out, s, n_embd);
            common_batch_clear(batch);
            p += s;
            s = 0;
        }

        // add to batch
        batch_add_seq(batch, inp, s);
        s += 1;
    }

    // final batch
    float * out = emb + p * n_embd;
    batch_decode(ctx, batch, out, s, n_embd);

    // save embeddings to chunks
    for (int i = 0; i < n_chunks; i++) {
        chunks[i].embedding = std::vector<float>(emb + i * n_embd, emb + (i + 1) * n_embd);
        // clear tokens as they are no longer needed
        chunks[i].tokens.clear();
    }

    struct llama_batch query_batch = llama_batch_init(n_batch, 0, 1);

    // start loop, receive query and return top k similar chunks based on cosine similarity
    std::string query;
    while (true) {
        LOG("Enter query: ");
        std::getline(std::cin, query);
        std::vector<int32_t> query_tokens = common_tokenize(ctx, query, true);

        batch_add_seq(query_batch, query_tokens, 0);

        std::vector<float> query_emb(n_embd, 0);
        batch_decode(ctx, query_batch, query_emb.data(), 1, n_embd);

        common_batch_clear(query_batch);

        // compute cosine similarities
        {
            std::vector<std::pair<int, float>> similarities;
            for (int i = 0; i < n_chunks; i++) {
                float sim = common_embd_similarity_cos(chunks[i].embedding.data(), query_emb.data(), n_embd);
                similarities.push_back(std::make_pair(i, sim));
            }

            // sort similarities
            std::sort(similarities.begin(), similarities.end(), [](const std::pair<int, float> & a, const std::pair<int, float> & b) {
                return a.second > b.second;
            });

            LOG("Top %d similar chunks:\n", params.sampling.top_k);
            for (int i = 0; i < std::min(params.sampling.top_k, (int) chunks.size()); i++) {
                LOG("filename: %s\n", chunks[similarities[i].first].filename.c_str());
                LOG("filepos: %lld\n", (long long int) chunks[similarities[i].first].filepos);
                LOG("similarity: %f\n", similarities[i].second);
                LOG("textdata:\n%s\n", chunks[similarities[i].first].textdata.c_str());
                LOG("--------------------\n");
            }
        }
    }

    LOG("\n");
    llama_perf_context_print(ctx);

    // clean up
    llama_batch_free(query_batch);
    llama_backend_free();
}